

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::PackHalf2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackHalf2x16CaseInstance *this)

{
  pointer *this_00;
  int iVar1;
  bool bVar2;
  deUint32 dVar3;
  float *pfVar4;
  pointer pVVar5;
  reference pVVar6;
  size_type sVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ShaderExecutor *pSVar10;
  reference pvVar11;
  reference pvVar12;
  float fVar13;
  float y_;
  int local_7c4;
  allocator<char> local_791;
  string local_790;
  undefined4 local_770;
  allocator<char> local_769;
  string local_768;
  int local_744;
  MessageBuilder local_740;
  MessageBuilder local_5c0;
  Hex<8UL> local_440;
  Hex<8UL> local_438;
  MessageBuilder local_430;
  int local_2ac;
  int local_2a8;
  int diff1;
  int diff0;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  int iStack_290;
  deUint16 ref1;
  int iStack_28c;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  reference local_278;
  void *out;
  void *in;
  MessageBuilder local_260;
  Float<unsigned_short,_5,_10,_15,_3U> local_dc;
  Float<unsigned_short,_5,_10,_15,_3U> local_da;
  Vector<float,_2> local_d8;
  __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_d0;
  __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
  local_c8;
  iterator inVal;
  deUint32 mantissa;
  int exp;
  int s;
  int c;
  Vec2 v;
  int ndx;
  int maxExp;
  int minExp;
  Vector<float,_2> local_8c;
  Vector<float,_2> local_84;
  Vector<float,_2> local_7c [2];
  Vector<float,_2> local_68;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  Random rnd;
  int maxDiff;
  PackHalf2x16CaseInstance *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x10001246 = this;
  dVar3 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  de::Random::Random((Random *)
                     ((long)&inputs.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     dVar3 ^ 0x776002);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  tcu::Vector<float,_2>::Vector(&local_68,0.0,0.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_68);
  tcu::Vector<float,_2>::Vector(local_7c,0.5,1.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_7c);
  tcu::Vector<float,_2>::Vector(&local_84,1.0,0.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Vector<float,_2>::Vector(&local_8c,-0.5,1.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_8c);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&maxExp,0.25,0.75);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&maxExp);
  v.m_data[1] = 2.10195e-44;
  for (v.m_data[0] = 0.0; (int)v.m_data[0] < 0x5f; v.m_data[0] = (float)((int)v.m_data[0] + 1)) {
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&s);
    for (exp = 0; exp < 2; exp = exp + 1) {
      bVar2 = de::Random::getBool((Random *)
                                  ((long)&inputs.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_7c4 = de::Random::getInt((Random *)
                                     ((long)&inputs.
                                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,-0xe,0xf);
      dVar3 = de::Random::getUint32
                        ((Random *)
                         ((long)&inputs.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (local_7c4 == 0) {
        local_7c4 = 1;
      }
      inVal._M_current._4_4_ =
           tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                     (bVar2 - 1 | 1,local_7c4,dVar3 & 0x7fffff | 0x800000);
      fVar13 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat
                         ((Float<unsigned_int,_8,_23,_127,_3U> *)((long)&inVal._M_current + 4));
      pfVar4 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)&s,exp);
      *pfVar4 = fVar13;
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&s);
  }
  local_c8._M_current =
       (Vector<float,_2> *)
       std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::begin
                 ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                  &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_d0._M_current =
         (Vector<float,_2> *)
         std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::end
                   ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                    &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    if (!bVar2) break;
    pVVar5 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator->(&local_c8);
    pfVar4 = tcu::Vector<float,_2>::x(pVVar5);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_da,*pfVar4);
    fVar13 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_da);
    pVVar5 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator->(&local_c8);
    pfVar4 = tcu::Vector<float,_2>::y(pVVar5);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_dc,*pfVar4);
    y_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_dc);
    tcu::Vector<float,_2>::Vector(&local_d8,fVar13,y_);
    pVVar6 = __gnu_cxx::
             __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
             ::operator*(&local_c8);
    *&pVVar6->m_data = local_d8.m_data;
    __gnu_cxx::
    __normal_iterator<tcu::Vector<float,_2>_*,_std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>_>
    ::operator++(&local_c8);
  }
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,sVar7);
  pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_260,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(unsigned_long *)&in);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  this_00 = &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  out = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)this_00
                   ,0);
  local_278 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,0);
  pSVar10 = de::details::
            UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            ::operator->(&(this->super_ShaderPackingFunctionTestInstance).m_executor.
                          super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                        );
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     this_00);
  ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&maxPrints,0);
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,sVar7 & 0xffffffff,&out,&local_278,_maxPrints);
  sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar7;
  valNdx = 10;
  iStack_28c = 0;
  for (iStack_290 = 0; iVar1 = iStack_290,
      sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage), iVar1 < (int)sVar7;
      iStack_290 = iStack_290 + 1) {
    pvVar11 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_290);
    pfVar4 = tcu::Vector<float,_2>::x(pvVar11);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&ref,*pfVar4);
    ref._2_2_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&ref);
    pvVar11 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_290);
    pfVar4 = tcu::Vector<float,_2>::y(pvVar11);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&res,*pfVar4);
    res._2_2_ = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                          ((Float<unsigned_short,_5,_10,_15,_3U> *)&res);
    _res1 = CONCAT22(res._2_2_,ref._2_2_);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                         (long)iStack_290);
    diff0 = *pvVar12;
    diff1._2_2_ = (undefined2)diff0;
    diff1._0_2_ = (ushort)((uint)diff0 >> 0x10);
    local_2a8 = de::abs<int>((uint)ref._2_2_ - (diff0 & 0xffffU));
    local_2ac = de::abs<int>((uint)res._2_2_ - (uint)(ushort)diff1);
    if ((0 < local_2a8) || (0 < local_2ac)) {
      if (iStack_28c < 10) {
        pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_430,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_430,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&stack0xfffffffffffffd70);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [25])", expected packHalf2x16(");
        pvVar11 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&outputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iStack_290)
        ;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,pvVar11);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x131b1b7);
        local_438 = tcu::toHex<unsigned_int>(_res1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_438);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x1386d38);
        local_440 = tcu::toHex<unsigned_int>(diff0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_440);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])"\n  diffs = (");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2a8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2ac);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])"), max diff = ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_430);
      }
      else if (iStack_28c == 10) {
        pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_5c0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_5c0,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5c0);
      }
      iStack_28c = iStack_28c + 1;
    }
  }
  pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_740,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  local_744 = numFailed - iStack_28c;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_740,&local_744);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&numFailed);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_740);
  if (iStack_28c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"Pass",&local_769);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_768);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator(&local_769);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_790,"Result comparison failed",&local_791);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_790);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
  }
  local_770 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}